

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void GC::MarkUsedBlocks(void)

{
  long lVar1;
  long lVar2;
  void *ptr;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  ExternLocalInfo *pEVar6;
  void *pvVar7;
  void *pvVar8;
  char *basePtr;
  uint i;
  ulong uVar9;
  uint frame;
  ulong uVar10;
  EVP_PKEY_CTX *in_RSI;
  long lVar11;
  int iVar12;
  uint i_1;
  uint *puVar13;
  int *piVar14;
  int local_54;
  void *unknownExec;
  int local_44;
  int *local_40;
  long local_38;
  
  lVar1 = *(long *)(NULLC::commonLinker + 0x240);
  lVar2 = *(long *)(NULLC::commonLinker + 0x200);
  lVar11 = *(long *)(NULLC::commonLinker + 0x230);
  HashMap<int>::init((HashMap<int> *)&functionIDs,in_RSI);
  _DAT_0041c0a0 = functionIDs;
  _DAT_0041c0a8 = 0xffc;
  if (functionIDs != 0) {
    _DAT_0041c0a8 = 0;
  }
  memset(DAT_0041c0b0,0,0x2000);
  curr = &rootsA;
  _DAT_0041c074 = 0;
  next = &rootsB;
  _DAT_0041c084 = 0;
  unknownExec = (void *)0x0;
  uVar3 = nullcGetCurrentExecutor(&unknownExec);
  if (uVar3 != 2) {
    puVar13 = (uint *)(lVar11 + 0xc);
    for (uVar10 = 0; uVar10 < *(uint *)(NULLC::commonLinker + 0x23c); uVar10 = uVar10 + 1) {
      CheckVariable((char *)((ulong)*puVar13 + (long)unmanageableBase),
                    (ExternTypeInfo *)((ulong)puVar13[-1] * 0x50 + lVar2));
      puVar13 = puVar13 + 4;
    }
    frame = 0;
    if (uVar3 < 2) {
      local_54 = *(int *)(NULLC::commonLinker + 0x750);
      piVar14 = (int *)(lVar1 + 8);
      local_38 = lVar1;
LAB_002213e0:
      if (uVar3 == 1) {
        uVar4 = ExecutorX86::GetCallStackAddress((ExecutorX86 *)unknownExec,frame);
        pvVar8 = unknownExec;
        if (uVar4 == 0) goto LAB_00221542;
      }
      else {
        uVar4 = ExecutorRegVm::GetCallStackAddress((ExecutorRegVm *)unknownExec,frame);
        pvVar8 = unknownExec;
        if (uVar4 == 0) {
          pvVar7 = ExecutorRegVm::GetStackStart((ExecutorRegVm *)unknownExec);
          pvVar8 = ExecutorRegVm::GetStackEnd((ExecutorRegVm *)pvVar8);
          goto LAB_00221574;
        }
      }
      piVar5 = HashMap<int>::find((HashMap<int> *)&functionIDs,uVar4);
      if (piVar5 == (int *)0x0) {
        uVar10 = 0xffffffffffffffff;
        piVar5 = piVar14;
        for (uVar9 = 0; iVar12 = (int)uVar10, *(uint *)(NULLC::commonLinker + 0x24c) != uVar9;
            uVar9 = uVar9 + 1) {
          if ((piVar5[-1] <= (int)uVar4) &&
             (uVar10 = uVar10 & 0xffffffff, (int)uVar4 < piVar5[-1] + *piVar5)) {
            uVar10 = uVar9 & 0xffffffff;
          }
          piVar5 = piVar5 + 0x25;
        }
        HashMap<int>::insert((HashMap<int> *)&functionIDs,uVar4,iVar12);
      }
      else {
        iVar12 = *piVar5;
      }
      frame = frame + 1;
      if (iVar12 != -1) {
        lVar1 = local_38 + (long)iVar12 * 0x94;
        local_44 = 0x10 - local_54 % 0x10;
        if (local_54 % 0x10 == 0) {
          local_44 = 0;
        }
        local_44 = local_44 + local_54;
        iVar12 = *(int *)(local_38 + 0x68 + (long)iVar12 * 0x94);
        lVar11 = (long)local_44;
        local_40 = piVar14;
        for (uVar4 = 0; uVar4 < *(uint *)(lVar1 + 0x58); uVar4 = uVar4 + 1) {
          pEVar6 = FastVector<ExternLocalInfo,_false,_false>::operator[]
                             ((FastVector<ExternLocalInfo,_false,_false> *)
                              (NULLC::commonLinker + 0x270),*(int *)(lVar1 + 0x50) + uVar4);
          CheckVariable((char *)((long)unmanageableBase + (ulong)pEVar6->offset + lVar11),
                        (ExternTypeInfo *)((ulong)pEVar6->type * 0x50 + lVar2));
        }
        if (*(int *)(lVar1 + 0x4c) != -1) {
          CheckPointer((char *)((long)unmanageableBase + (ulong)*(uint *)(lVar1 + 100) + lVar11 + -8
                               ));
        }
        local_54 = (iVar12 + 0xfU & 0xfffffff0) + local_44;
        piVar14 = local_40;
      }
      goto LAB_002213e0;
    }
  }
  pvVar8 = (void *)0x0;
  pvVar7 = (void *)0x0;
LAB_0022157c:
  for (pvVar7 = (void *)((long)pvVar7 + 8); pvVar7 <= pvVar8; pvVar7 = (void *)((long)pvVar7 + 4)) {
    ptr = *(void **)((long)pvVar7 + -8);
    if (((void *)0x10000 < ptr) && ((ptr < unmanageableBase || (unmanageableTop < ptr)))) {
      basePtr = (char *)NULLC::GetBasePointer(ptr);
      if ((basePtr != (char *)0x0) && ((*(ulong *)(basePtr + -8) & 2) == 0)) {
        PrintMarker(*(ulong *)(basePtr + -8));
        if ((*(ulong *)(basePtr + -8) & 1) == 0) {
          *(ulong *)(basePtr + -8) = *(ulong *)(basePtr + -8) | 1;
          CheckBasePointer(basePtr);
        }
      }
    }
  }
  MarkPendingRoots();
  return;
LAB_00221542:
  pvVar7 = ExecutorX86::GetStackStart((ExecutorX86 *)unknownExec);
  pvVar8 = ExecutorX86::GetStackEnd((ExecutorX86 *)pvVar8);
LAB_00221574:
  if (pvVar8 < pvVar7) {
    __assert_fail("tempStackTop >= tempStackBase",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                  ,0x493,"void GC::MarkUsedBlocks()");
  }
  goto LAB_0022157c;
}

Assistant:

void GC::MarkUsedBlocks()
{
	GC_DEBUG_PRINT("Unmanageable range: %p-%p\n", GC::unmanageableBase, GC::unmanageableTop);

	// Get information about programs' functions, variables, types and symbols (for debug output)
	ExternFuncInfo	*functions = NULLC::commonLinker->exFunctions.data;
	ExternVarInfo	*vars = NULLC::commonLinker->exVariables.data;
	ExternTypeInfo	*types = NULLC::commonLinker->exTypes.data;
	char			*symbols = NULLC::commonLinker->exSymbols.data;
	(void)symbols;

	GC::functionIDs.init();
	GC::functionIDs.clear();

	GC::curr = &GC::rootsA;
	GC::next = &GC::rootsB;
	GC::curr->clear();
	GC::next->clear();

	// To check every stack frame, we have to get it first. But we have multiple executors, so flow alternates depending on which executor we are running
	void *unknownExec = NULL;
	unsigned int execID = nullcGetCurrentExecutor(&unknownExec);

	if(execID != NULLC_LLVM)
	{
		// Mark global variables
		for(unsigned int i = 0; i < NULLC::commonLinker->exVariables.size(); i++)
		{
			GC_DEBUG_PRINT("Global %s %s (with offset of %d)\n", symbols + types[vars[i].type].offsetToName, symbols + vars[i].offsetToName, vars[i].offset);
			GC::CheckVariable(GC::unmanageableBase + vars[i].offset, types[vars[i].type]);
		}
	}
	else
	{
#ifdef NULLC_LLVM_SUPPORT
		ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;

		unsigned count = 0;
		char *data = exec->GetVariableData(&count);

		for(unsigned int i = 0; i < NULLC::commonLinker->exVariables.size(); i++)
		{
			GC_DEBUG_PRINT("Global %s %s (with offset of %d)\n", symbols + types[vars[i].type].offsetToName, symbols + vars[i].offsetToName, vars[i].offset);
			GC::CheckVariable(data + vars[i].offset, types[vars[i].type]);
		}
#endif
	}

	// Starting stack offset is equal to global variable size
	int offset = NULLC::commonLinker->globalVarSize;

	// Init stack trace
	unsigned currentFrame = 0;

	// Mark local variables
	while(true)
	{
		int address = 0;

		// Get next address from call stack

#ifdef NULLC_BUILD_X86_JIT
		if(execID == NULLC_X86)
		{
			ExecutorX86 *exec = (ExecutorX86*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}
#endif

#ifdef NULLC_LLVM_SUPPORT
		if(execID == NULLC_LLVM)
		{
			ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}
#endif

		if(execID == NULLC_REG_VM)
		{
			ExecutorRegVm *exec = (ExecutorRegVm*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}

		// If failed, exit
		if(address == 0)
			break;

		// Find corresponding function
		int *cachedFuncID = GC::functionIDs.find(address);

		int funcID = -1;
		if(cachedFuncID)
		{
			funcID = *cachedFuncID;
		}
		else
		{
			for(unsigned i = 0; i < NULLC::commonLinker->exFunctions.size(); i++)
			{
				if(address >= functions[i].regVmAddress && address < (functions[i].regVmAddress + functions[i].regVmCodeSize))
					funcID = i;
			}

			GC::functionIDs.insert(address, funcID);
		}

		// If we are not in global scope
		if(funcID != -1)
		{
			ExternFuncInfo &function = functions[funcID];

			// Align offset to the first variable (by 16 byte boundary)
			int alignOffset = (offset % 16 != 0) ? (16 - (offset % 16)) : 0;
			offset += alignOffset;
			GC_DEBUG_PRINT("In function %s (with offset of %d)\n", symbols + function.offsetToName, alignOffset);

			unsigned stackSize = (function.stackSize + 0xf) & ~0xf;

			// Check every function local
			for(unsigned i = 0; i < function.localCount; i++)
			{
				// Get information about local
				ExternLocalInfo &lInfo = NULLC::commonLinker->exLocals[function.offsetToFirstLocal + i];

				GC_DEBUG_PRINT("Local %s %s (with offset of %d+%d)\n", symbols + types[lInfo.type].offsetToName, symbols + lInfo.offsetToName, offset, lInfo.offset);
				// Check it
				GC::CheckVariable(GC::unmanageableBase + offset + lInfo.offset, types[lInfo.type]);
			}

			if(function.contextType != ~0u)
			{
				GC_DEBUG_PRINT("Local %s $context (with offset of %d+%d)\n", symbols + types[function.contextType].offsetToName, offset, function.argumentSize - NULLC_PTR_SIZE);
				char *ptr = GC::unmanageableBase + offset + function.argumentSize - NULLC_PTR_SIZE;
				GC::CheckPointer(ptr);
			}

			offset += stackSize;

			GC_DEBUG_PRINT("Moving offset to next frame by %d bytes\n", stackSize);
		}
	}

	// Check for pointers in stack
	char *tempStackBase = NULL, *tempStackTop = NULL;

#ifdef NULLC_BUILD_X86_JIT
	if(execID == NULLC_X86)
	{
		ExecutorX86 *exec = (ExecutorX86*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}
#endif

#ifdef NULLC_LLVM_SUPPORT
	if(execID == NULLC_LLVM)
	{
		ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}
#endif

	if(execID == NULLC_REG_VM)
	{
		ExecutorRegVm *exec = (ExecutorRegVm*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}

	GC_DEBUG_PRINT("Check stack from %p to %p\n", tempStackBase, tempStackTop);

	// Check that temporary stack range is correct
	assert(tempStackTop >= tempStackBase);

	// Check temporary stack for pointers
	while(tempStackBase + sizeof(void*) <= tempStackTop)
	{
		char *ptr = GC::ReadVmMemoryPointer(tempStackBase);

		// Check for unmanageable ranges. Range of 0x00000000-0x00010000 is unmanageable by default due to upvalues with offsets inside closures.
		if(ptr > (char*)0x00010000 && (ptr < GC::unmanageableBase || ptr > GC::unmanageableTop))
		{
			// Get pointer base
			unsigned int *basePtr = (unsigned int*)NULLC::GetBasePointer(ptr);
			// If there is no base, this pointer points to memory that is not GCs memory
			if(basePtr)
			{
				GC_DEBUG_PRINT("\tGlobal pointer [stack] %p\n", ptr);

				GC_DEBUG_PRINT("\tPointer base is %p\n", basePtr);

				markerType *marker = (markerType*)((char*)basePtr - sizeof(markerType));

				// Might step on a left-over pointer in stale registers
				if(*marker & OBJECT_FREED)
				{
					tempStackBase += 4;
					continue;
				}

				GC::PrintMarker(*marker);

				// If block is unmarked, mark it as used
				if(!(*marker & OBJECT_VISIBLE))
				{
					*marker |= OBJECT_VISIBLE;

					GC_DEBUG_PRINT("\tMarked as used, checking content\n");

					GC::CheckBasePointer((char*)basePtr);
				}
			}
		}
		tempStackBase += 4;
	}

	GC::MarkPendingRoots();
}